

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O3

bool __thiscall
bssl::SSLAEADContext::Open
          (SSLAEADContext *this,Span<unsigned_char> *out,uint8_t type,uint16_t record_version,
          uint64_t seqnum,Span<const_unsigned_char> header,Span<unsigned_char> in)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  byte bVar5;
  ushort uVar6;
  ulong __n;
  ulong __n_00;
  byte bVar7;
  bool bVar8;
  size_t len;
  uint8_t ad_storage [13];
  uint8_t nonce [32];
  
  if (this->cipher_ == (SSL_CIPHER *)0x0) {
    out->data_ = in.data_;
    out->size_ = in.size_;
    return true;
  }
  bVar7 = this->field_0x26a;
  if ((bVar7 & 8) == 0) {
    sVar3 = MaxOverhead(this);
    uVar1 = CONCAT11(ad_storage[9],ad_storage[10]);
    uVar6 = (short)in.size_ - (short)sVar3;
    if (sVar3 <= in.size_) {
      bVar7 = this->field_0x26a;
      goto LAB_0014affb;
    }
    iVar2 = 0xf2;
LAB_0014b0f5:
    ad_storage[9] = (uint8_t)(uVar1 >> 8);
    ad_storage[10] = (uint8_t)uVar1;
    bVar8 = false;
    ERR_put_error(0x10,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,iVar2);
  }
  else {
    uVar6 = 0;
LAB_0014affb:
    uVar1 = CONCAT11(ad_storage[9],ad_storage[10]);
    if ((bVar7 & 0x10) == 0) {
      ad_storage._0_8_ =
           seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 | (seqnum & 0xff0000000000) >> 0x18
           | (seqnum & 0xff00000000) >> 8 | (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18
           | (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
      header.data_ = ad_storage;
      header.size_ = 0xb;
      ad_storage[8] = type;
      uVar1 = record_version;
      if ((bVar7 & 8) == 0) {
        ad_storage._11_2_ = uVar6 << 8 | uVar6 >> 8;
        header.size_ = 0xd;
      }
    }
    ad_storage[9] = (uint8_t)(uVar1 >> 8);
    ad_storage[10] = (uint8_t)uVar1;
    bVar5 = (this->fixed_nonce_).size_;
    __n_00 = (ulong)bVar5;
    if ((bVar7 & 4) == 0) {
      if (bVar5 != 0) {
        memcpy(nonce,&this->fixed_nonce_,__n_00);
        goto LAB_0014b0a9;
      }
      bVar5 = 0;
LAB_0014b0c0:
      __n_00 = 0;
    }
    else {
      __n_00 = __n_00 - this->variable_nonce_len_;
      if (__n_00 == 0) goto LAB_0014b0c0;
      memset(nonce,0,__n_00);
LAB_0014b0a9:
      uVar1 = CONCAT11(ad_storage[9],ad_storage[10]);
    }
    ad_storage[9] = (uint8_t)(uVar1 >> 8);
    ad_storage[10] = (uint8_t)uVar1;
    if ((bVar7 & 1) == 0) {
      if (this->variable_nonce_len_ != '\b') {
        __assert_fail("variable_nonce_len_ == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x113,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      *(uint64_t *)(nonce + __n_00) =
           seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 | (seqnum & 0xff0000000000) >> 0x18
           | (seqnum & 0xff00000000) >> 8 | (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18
           | (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
      __n = 8;
    }
    else {
      __n = (ulong)this->variable_nonce_len_;
      bVar8 = in.size_ < __n;
      in.size_ = in.size_ - __n;
      if (bVar8) {
        iVar2 = 0x10d;
        goto LAB_0014b0f5;
      }
      if (__n != 0) {
        memcpy(nonce + __n_00,in.data_,__n);
        uVar1 = CONCAT11(ad_storage[9],ad_storage[10]);
      }
      in.data_ = in.data_ + __n;
    }
    ad_storage[9] = (uint8_t)(uVar1 >> 8);
    ad_storage[10] = (uint8_t)uVar1;
    sVar3 = __n_00 + __n;
    if ((bVar7 & 4) != 0) {
      if (sVar3 != bVar5) {
        __assert_fail("nonce_len == fixed_nonce_.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x11a,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      if (bVar5 != 0) {
        sVar4 = 0;
        do {
          nonce[sVar4] = nonce[sVar4] ^ (this->fixed_nonce_).storage_[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar3 != sVar4);
      }
    }
    iVar2 = EVP_AEAD_CTX_open(&(this->ctx_).ctx_,in.data_,&len,in.size_,nonce,sVar3,in.data_,
                              in.size_,header.data_,header.size_);
    bVar8 = iVar2 != 0;
    if (bVar8) {
      if (in.size_ < len) {
        len = in.size_;
      }
      out->data_ = in.data_;
      out->size_ = len;
    }
  }
  return bVar8;
}

Assistant:

bool SSLAEADContext::Open(Span<uint8_t> *out, uint8_t type,
                          uint16_t record_version, uint64_t seqnum,
                          Span<const uint8_t> header, Span<uint8_t> in) {
  if (is_null_cipher() || CRYPTO_fuzzer_mode_enabled()) {
    // Handle the initial NULL cipher.
    *out = in;
    return true;
  }

  // TLS 1.2 AEADs include the length in the AD and are assumed to have fixed
  // overhead. Otherwise the parameter is unused.
  size_t plaintext_len = 0;
  if (!omit_length_in_ad_) {
    size_t overhead = MaxOverhead();
    if (in.size() < overhead) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    plaintext_len = in.size() - overhead;
  }

  uint8_t ad_storage[13];
  Span<const uint8_t> ad = GetAdditionalData(ad_storage, type, record_version,
                                             seqnum, plaintext_len, header);

  // Assemble the nonce.
  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  size_t nonce_len = 0;

  // Prepend the fixed nonce, or left-pad with zeros if XORing.
  if (xor_fixed_nonce_) {
    nonce_len = fixed_nonce_.size() - variable_nonce_len_;
    OPENSSL_memset(nonce, 0, nonce_len);
  } else {
    OPENSSL_memcpy(nonce, fixed_nonce_.data(), fixed_nonce_.size());
    nonce_len += fixed_nonce_.size();
  }

  // Add the variable nonce.
  if (variable_nonce_included_in_record_) {
    if (in.size() < variable_nonce_len_) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    OPENSSL_memcpy(nonce + nonce_len, in.data(), variable_nonce_len_);
    in = in.subspan(variable_nonce_len_);
  } else {
    assert(variable_nonce_len_ == 8);
    CRYPTO_store_u64_be(nonce + nonce_len, seqnum);
  }
  nonce_len += variable_nonce_len_;

  // XOR the fixed nonce, if necessary.
  if (xor_fixed_nonce_) {
    assert(nonce_len == fixed_nonce_.size());
    for (size_t i = 0; i < fixed_nonce_.size(); i++) {
      nonce[i] ^= fixed_nonce_[i];
    }
  }

  // Decrypt in-place.
  size_t len;
  if (!EVP_AEAD_CTX_open(ctx_.get(), in.data(), &len, in.size(), nonce,
                         nonce_len, in.data(), in.size(), ad.data(),
                         ad.size())) {
    return false;
  }
  *out = in.subspan(0, len);
  return true;
}